

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalysis.cpp
# Opt level: O1

void __thiscall
luna::SemanticAnalysisVisitor::Visit
          (SemanticAnalysisVisitor *this,UnaryExpression *unary_exp,void *data)

{
  int iVar1;
  SyntaxTree *pSVar2;
  undefined4 uVar3;
  SemanticException *this_00;
  ExpVarData exp_var_data;
  undefined8 local_24;
  undefined1 local_1c;
  
  local_24 = 1;
  local_1c = 0;
  pSVar2 = (unary_exp->exp_)._M_t.
           super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
           super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
           super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  (*pSVar2->_vptr_SyntaxTree[2])(pSVar2,this,&local_24);
  if (local_24._4_4_ != 0) {
    iVar1 = (unary_exp->op_token_).token_;
    if (iVar1 == 0x23) {
      if ((local_24._4_4_ & 0xfffffffd) == 4) goto LAB_00154b36;
      this_00 = (SemanticException *)__cxa_allocate_exception(0x20);
      SemanticException::SemanticException
                (this_00,"operand is not table or string",&unary_exp->op_token_);
    }
    else {
      if ((iVar1 != 0x2d) || (local_24._4_4_ == 3)) goto LAB_00154b36;
      this_00 = (SemanticException *)__cxa_allocate_exception(0x20);
      SemanticException::SemanticException(this_00,"operand is not number",&unary_exp->op_token_);
    }
    __cxa_throw(this_00,&SemanticException::typeinfo,Exception::~Exception);
  }
LAB_00154b36:
  iVar1 = (unary_exp->op_token_).token_;
  uVar3 = 3;
  if ((iVar1 != 0x23) && (iVar1 != 0x2d)) {
    if (iVar1 != 0x10d) {
      __assert_fail("!\"unexpect unary operator\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/SemanticAnalysis.cpp"
                    ,0x247,
                    "virtual void luna::SemanticAnalysisVisitor::Visit(UnaryExpression *, void *)");
    }
    uVar3 = 2;
  }
  *(undefined4 *)((long)data + 4) = uVar3;
  return;
}

Assistant:

void SemanticAnalysisVisitor::Visit(UnaryExpression *unary_exp, void *data)
    {
        // Unary expression is read semantic
        ExpVarData exp_var_data{ SemanticOp_Read };
        unary_exp->exp_->Accept(this, &exp_var_data);

        // Expression type
        if (exp_var_data.exp_type_ != ExpType_Unknown)
        {
            switch (unary_exp->op_token_.token_)
            {
                case '-':
                    if (exp_var_data.exp_type_ != ExpType_Number)
                        throw SemanticException("operand is not number",
                                                unary_exp->op_token_);
                    break;
                case '#':
                    if (exp_var_data.exp_type_ != ExpType_Table &&
                        exp_var_data.exp_type_ != ExpType_String)
                        throw SemanticException("operand is not table or string",
                                                unary_exp->op_token_);
                    break;
                default:
                    break;
            }
        }

        auto parent_exp_var_data = static_cast<ExpVarData *>(data);
        if (unary_exp->op_token_.token_ == '-' ||
            unary_exp->op_token_.token_ == '#')
            parent_exp_var_data->exp_type_ = ExpType_Number;
        else if (unary_exp->op_token_.token_ == Token_Not)
            parent_exp_var_data->exp_type_ = ExpType_Bool;
        else
            assert(!"unexpect unary operator");
    }